

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseUint128(char *s,char *end,v128 *out)

{
  v128 *pvVar1;
  uint32_t uVar2;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t overflow;
  uint32_t carry_into_v3;
  uint32_t carry_into_v2;
  uint32_t carry_into_v1;
  uint32_t digit;
  v128 *out_local;
  char *end_local;
  char *s_local;
  
  _carry_into_v1 = out;
  out_local = (v128 *)end;
  end_local = s;
  if (s == end) {
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  else {
    v128::set_zero(out);
    while (pvVar1 = _carry_into_v1, carry_into_v2 = (int)*end_local - 0x30, carry_into_v2 < 10) {
      carry_into_v3 = 0;
      overflow = 0;
      local_38 = 0;
      local_3c = 0;
      uVar2 = v128::u32(_carry_into_v1,0);
      uVar2 = anon_unknown_0::AddWithCarry(uVar2,carry_into_v2,&carry_into_v3);
      v128::set_u32(pvVar1,0,uVar2);
      pvVar1 = _carry_into_v1;
      uVar2 = v128::u32(_carry_into_v1,1);
      uVar2 = anon_unknown_0::AddWithCarry(uVar2,carry_into_v3,&overflow);
      v128::set_u32(pvVar1,1,uVar2);
      pvVar1 = _carry_into_v1;
      uVar2 = v128::u32(_carry_into_v1,2);
      uVar2 = anon_unknown_0::AddWithCarry(uVar2,overflow,&local_38);
      v128::set_u32(pvVar1,2,uVar2);
      pvVar1 = _carry_into_v1;
      uVar2 = v128::u32(_carry_into_v1,3);
      uVar2 = anon_unknown_0::AddWithCarry(uVar2,local_38,&local_3c);
      v128::set_u32(pvVar1,3,uVar2);
      if (local_3c != 0) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      end_local = end_local + 1;
      if ((v128 *)end_local == out_local) {
        Result::Result((Result *)((long)&s_local + 4),Ok);
        return (Result)s_local._4_4_;
      }
      anon_unknown_0::Mul10(_carry_into_v1);
    }
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result ParseUint128(const char* s,
                    const char* end,
                    v128* out) {
  if (s == end) {
    return Result::Error;
  }

  out->set_zero();

  while (true) {
    uint32_t digit = (*s - '0');
    if (digit > 9) {
      return Result::Error;
    }

    uint32_t carry_into_v1 = 0;
    uint32_t carry_into_v2 = 0;
    uint32_t carry_into_v3 = 0;
    uint32_t overflow = 0;
    out->set_u32(0, AddWithCarry(out->u32(0), digit, &carry_into_v1));
    out->set_u32(1, AddWithCarry(out->u32(1), carry_into_v1, &carry_into_v2));
    out->set_u32(2, AddWithCarry(out->u32(2), carry_into_v2, &carry_into_v3));
    out->set_u32(3, AddWithCarry(out->u32(3), carry_into_v3, &overflow));
    if (overflow) {
      return Result::Error;
    }

    ++s;

    if (s == end) {
      break;
    }

    Mul10(out);
  }
  return Result::Ok;
}